

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_name_formatter.cpp
# Opt level: O2

string * __thiscall
dpfb::ImageNameFormatter::getImageName_abi_cxx11_
          (string *__return_storage_ptr__,ImageNameFormatter *this,size_t imageIdx)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((this->prefix)._M_string_length != 0) {
    std::operator+(&bStack_38,&this->prefix,'_');
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&bStack_38);
  }
  str::format_abi_cxx11_(&bStack_38,"%0*zu",(ulong)(uint)this->numDigits,imageIdx);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&bStack_38);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string ImageNameFormatter::getImageName(std::size_t imageIdx) const
{
    std::string result;

    if (!prefix.empty())
        result += prefix + '_';

    result += str::format("%0*zu", numDigits, imageIdx);
    result += extension;

    return result;
}